

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_common.cc
# Opt level: O0

void ScaleFilterCols64_16_C(uint16_t *dst_ptr,uint16_t *src_ptr,int dst_width,int x32,int dx)

{
  long lVar1;
  ulong uVar2;
  int b_1;
  int a_1;
  int64_t xi_1;
  int b;
  int a;
  int64_t xi;
  int j;
  int64_t x;
  int dx_local;
  int x32_local;
  int dst_width_local;
  uint16_t *src_ptr_local;
  uint16_t *dst_ptr_local;
  
  x = (int64_t)x32;
  dst_ptr_local = dst_ptr;
  for (j = 0; lVar1 = x >> 0x10, j < dst_width + -1; j = j + 2) {
    *dst_ptr_local =
         src_ptr[lVar1] +
         (short)((x & 0xffffU) *
                 ((long)(int)(uint)src_ptr[lVar1 + 1] - (long)(int)(uint)src_ptr[lVar1]) + 0x8000 >>
                0x10);
    uVar2 = dx + x;
    dst_ptr_local[1] =
         src_ptr[(long)uVar2 >> 0x10] +
         (short)((uVar2 & 0xffff) *
                 ((long)(int)(uint)src_ptr[((long)uVar2 >> 0x10) + 1] -
                 (long)(int)(uint)src_ptr[(long)uVar2 >> 0x10]) + 0x8000 >> 0x10);
    x = (long)dx + uVar2;
    dst_ptr_local = dst_ptr_local + 2;
  }
  if ((dst_width & 1U) != 0) {
    *dst_ptr_local =
         src_ptr[lVar1] +
         (short)((x & 0xffffU) *
                 ((long)(int)(uint)src_ptr[lVar1 + 1] - (long)(int)(uint)src_ptr[lVar1]) + 0x8000 >>
                0x10);
  }
  return;
}

Assistant:

void ScaleFilterCols64_16_C(uint16_t* dst_ptr,
                            const uint16_t* src_ptr,
                            int dst_width,
                            int x32,
                            int dx) {
  int64_t x = (int64_t)(x32);
  int j;
  for (j = 0; j < dst_width - 1; j += 2) {
    int64_t xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
    x += dx;
    xi = x >> 16;
    a = src_ptr[xi];
    b = src_ptr[xi + 1];
    dst_ptr[1] = BLENDER(a, b, x & 0xffff);
    x += dx;
    dst_ptr += 2;
  }
  if (dst_width & 1) {
    int64_t xi = x >> 16;
    int a = src_ptr[xi];
    int b = src_ptr[xi + 1];
    dst_ptr[0] = BLENDER(a, b, x & 0xffff);
  }
}